

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vstat.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  bool bVar3;
  undefined1 uVar4;
  byte bVar5;
  reference ppcVar6;
  ostream *poVar7;
  long lVar8;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_18;
  ostringstream error_message_17;
  int num_data;
  ostringstream error_message_16;
  ostringstream error_message_15;
  int vector_index;
  vector<double,_std::allocator<double>_> data;
  ostringstream error_message_14;
  ostringstream error_message_13;
  ostringstream error_message_12;
  ostringstream error_message_11;
  SymmetricMatrix second;
  vector<double,_std::allocator<double>_> tmp_1;
  vector<double,_std::allocator<double>_> first;
  double num_data_1;
  ostringstream error_message_10;
  ifstream ifs2;
  char *file;
  iterator __end1;
  iterator __begin1;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range1;
  ostringstream error_message_9;
  Buffer buffer;
  StatisticsAccumulation accumulation;
  bool diagonal;
  istream *input_stream;
  ostringstream error_message_8;
  ifstream ifs;
  ostringstream error_message_7;
  char *input_file;
  ostringstream error_message_6;
  int num_input_files;
  ostringstream error_message_5;
  ostringstream error_message_4;
  int tmp;
  int max;
  int min;
  ostringstream error_message_3;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  bool numerically_stable;
  bool outputs_only_diagonal_elements;
  vector<const_char_*,_std::allocator<const_char_*>_> statistics_file;
  OutputFormats output_format;
  double confidence_level;
  int output_interval;
  int vector_length;
  option *in_stack_ffffffffffffd818;
  Buffer *buffer_00;
  Buffer *in_stack_ffffffffffffd820;
  string *in_stack_ffffffffffffd828;
  allocator *paVar9;
  undefined4 in_stack_ffffffffffffd830;
  int in_stack_ffffffffffffd834;
  SymmetricMatrix *in_stack_ffffffffffffd838;
  undefined7 in_stack_ffffffffffffd840;
  undefined1 in_stack_ffffffffffffd847;
  istream *in_stack_ffffffffffffd858;
  undefined6 in_stack_ffffffffffffd860;
  undefined1 in_stack_ffffffffffffd866;
  undefined1 in_stack_ffffffffffffd867;
  undefined8 in_stack_ffffffffffffd868;
  undefined8 in_stack_ffffffffffffd870;
  undefined1 *puVar10;
  undefined7 in_stack_ffffffffffffd880;
  undefined1 in_stack_ffffffffffffd887;
  ostream *in_stack_ffffffffffffd8b0;
  SymmetricMatrix *in_stack_ffffffffffffd8b8;
  char *local_26c8;
  undefined7 in_stack_ffffffffffffd978;
  vector<double,_std::allocator<double>_> *data_00;
  StatisticsAccumulation *in_stack_ffffffffffffd988;
  byte local_263a;
  Buffer *in_stack_ffffffffffffd9d8;
  SymmetricMatrix *in_stack_ffffffffffffd9e0;
  undefined5 in_stack_ffffffffffffd9e8;
  byte in_stack_ffffffffffffd9ed;
  undefined1 in_stack_ffffffffffffd9ee;
  undefined1 in_stack_ffffffffffffd9ef;
  char *in_stack_ffffffffffffd9f0;
  StatisticsAccumulation *in_stack_ffffffffffffd9f8;
  undefined5 in_stack_ffffffffffffda08;
  byte in_stack_ffffffffffffda0d;
  undefined1 in_stack_ffffffffffffda0e;
  undefined1 in_stack_ffffffffffffda0f;
  string *in_stack_ffffffffffffda10;
  bool local_25ca;
  bool local_25aa;
  allocator local_2589;
  string local_2588 [32];
  ostringstream local_2568 [231];
  undefined1 in_stack_ffffffffffffdb7f;
  double in_stack_ffffffffffffdb80;
  OutputFormats in_stack_ffffffffffffdb88;
  int in_stack_ffffffffffffdb8c;
  Buffer *in_stack_ffffffffffffdb90;
  StatisticsAccumulation *in_stack_ffffffffffffdb98;
  allocator local_23e9;
  string local_23e8 [32];
  ostringstream local_23c8 [376];
  int local_2250;
  allocator local_2249;
  string local_2248 [32];
  ostringstream local_2228 [383];
  allocator local_20a9;
  string local_20a8 [32];
  ostringstream local_2088 [376];
  int local_1f10;
  undefined1 local_1f09 [32];
  allocator local_1ee9;
  string local_1ee8 [32];
  ostringstream local_1ec8 [383];
  allocator local_1d49;
  string local_1d48 [32];
  ostringstream local_1d28 [383];
  allocator local_1ba9;
  string local_1ba8 [32];
  ostringstream local_1b88 [383];
  allocator local_1a09;
  string local_1a08 [32];
  ostringstream local_19e8 [519];
  allocator local_17e1;
  string local_17e0 [32];
  ostringstream local_17c0 [376];
  char local_1648 [520];
  char *local_1440;
  char **local_1438;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_1430;
  undefined1 *local_1428;
  allocator local_1419;
  string local_1418 [32];
  ostringstream local_13f8 [376];
  Buffer local_1280;
  StatisticsAccumulation local_1200;
  bool local_11e1;
  char *local_11e0;
  allocator local_11d1;
  string local_11d0 [32];
  ostringstream local_11b0 [376];
  char local_1038 [527];
  allocator local_e29;
  string local_e28 [32];
  ostringstream local_e08 [376];
  vector<double,_std::allocator<double>_> *local_c90;
  allocator local_c81;
  string local_c80 [32];
  ostringstream local_c60 [376];
  int local_ae8;
  allocator local_ae1;
  string local_ae0 [32];
  ostringstream local_ac0 [383];
  allocator local_941;
  string local_940 [32];
  ostringstream local_920 [383];
  allocator local_7a1;
  string local_7a0 [32];
  int local_780;
  undefined4 local_77c;
  undefined4 local_778;
  allocator local_771;
  string local_770 [32];
  ostringstream local_750 [383];
  undefined1 local_5d1 [40];
  allocator local_5a9;
  string local_5a8 [32];
  ostringstream local_588 [383];
  allocator local_409;
  string local_408 [39];
  allocator local_3e1;
  string local_3e0 [32];
  ostringstream local_3c0 [383];
  allocator local_241;
  string local_240 [32];
  int local_220;
  allocator local_219;
  string local_218 [32];
  ostringstream local_1f8 [383];
  allocator local_79;
  string local_78 [48];
  int local_48;
  byte local_42;
  byte local_41;
  undefined1 local_40 [28];
  int local_24;
  double local_20;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 1;
  local_18 = -1;
  local_20 = 95.0;
  local_24 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x103840);
  local_41 = 0;
  local_42 = 0;
LAB_00103850:
  local_48 = ya_getopt_long(in_stack_ffffffffffffd834,(char **)in_stack_ffffffffffffd828,
                            (char *)in_stack_ffffffffffffd820,in_stack_ffffffffffffd818,
                            (int *)0x103873);
  pcVar1 = ya_optarg;
  if (local_48 == -1) {
    if ((local_18 != -1) &&
       (bVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::empty
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                           CONCAT44(in_stack_ffffffffffffd834,in_stack_ffffffffffffd830)), !bVar3))
    {
      std::__cxx11::ostringstream::ostringstream(local_ac0);
      std::operator<<((ostream *)local_ac0,"Cannot specify -t option and -s option at the same time"
                     );
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ae0,"vstat",&local_ae1);
      sptk::PrintErrorMessage
                (in_stack_ffffffffffffda10,
                 (ostringstream *)
                 CONCAT17(in_stack_ffffffffffffda0f,
                          CONCAT16(in_stack_ffffffffffffda0e,
                                   CONCAT15(in_stack_ffffffffffffda0d,in_stack_ffffffffffffda08))));
      std::__cxx11::string::~string(local_ae0);
      std::allocator<char>::~allocator((allocator<char> *)&local_ae1);
      local_4 = 1;
      local_220 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_ac0);
      goto LAB_00105fac;
    }
    local_ae8 = local_8 - ya_optind;
    if (1 < local_ae8) {
      std::__cxx11::ostringstream::ostringstream(local_c60);
      std::operator<<((ostream *)local_c60,"Too many input files");
      paVar9 = &local_c81;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c80,"vstat",paVar9);
      sptk::PrintErrorMessage
                (in_stack_ffffffffffffda10,
                 (ostringstream *)
                 CONCAT17(in_stack_ffffffffffffda0f,
                          CONCAT16(in_stack_ffffffffffffda0e,
                                   CONCAT15(in_stack_ffffffffffffda0d,in_stack_ffffffffffffda08))));
      std::__cxx11::string::~string(local_c80);
      std::allocator<char>::~allocator((allocator<char> *)&local_c81);
      local_4 = 1;
      local_220 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_c60);
      goto LAB_00105fac;
    }
    if (local_ae8 == 0) {
      data_00 = (vector<double,_std::allocator<double>_> *)0x0;
    }
    else {
      data_00 = *(vector<double,_std::allocator<double>_> **)(local_10 + (long)ya_optind * 8);
    }
    local_c90 = data_00;
    uVar4 = sptk::SetBinaryMode();
    if (!(bool)uVar4) {
      std::__cxx11::ostringstream::ostringstream(local_e08);
      std::operator<<((ostream *)local_e08,"Cannot set translation mode");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e28,"vstat",&local_e29);
      sptk::PrintErrorMessage
                (in_stack_ffffffffffffda10,
                 (ostringstream *)
                 CONCAT17(in_stack_ffffffffffffda0f,
                          CONCAT16(in_stack_ffffffffffffda0e,
                                   CONCAT15(in_stack_ffffffffffffda0d,in_stack_ffffffffffffda08))));
      std::__cxx11::string::~string(local_e28);
      std::allocator<char>::~allocator((allocator<char> *)&local_e29);
      local_4 = 1;
      local_220 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_e08);
      goto LAB_00105fac;
    }
    std::ifstream::ifstream(local_1038);
    pvVar2 = local_c90;
    if (local_c90 != (vector<double,_std::allocator<double>_> *)0x0) {
      std::operator|(_S_in,_S_bin);
      std::ifstream::open(local_1038,(_Ios_Openmode)pvVar2);
      bVar5 = std::ios::fail();
      if ((bVar5 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_11b0);
        poVar7 = std::operator<<((ostream *)local_11b0,"Cannot open file ");
        std::operator<<(poVar7,(char *)local_c90);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_11d0,"vstat",&local_11d1);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffda10,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffda0f,
                            CONCAT16(in_stack_ffffffffffffda0e,
                                     CONCAT15(in_stack_ffffffffffffda0d,in_stack_ffffffffffffda08)))
                  );
        std::__cxx11::string::~string(local_11d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_11d1);
        local_4 = 1;
        local_220 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_11b0);
        goto LAB_00105f8e;
      }
    }
    bVar5 = std::ifstream::is_open();
    if ((bVar5 & 1) == 0) {
      local_26c8 = (char *)&std::cin;
    }
    else {
      local_26c8 = local_1038;
    }
    local_11e0 = local_26c8;
    local_11e1 = false;
    if (((local_24 == 0) || (local_24 == 2)) || (local_24 == 7)) {
      local_11e1 = (local_41 & 1) != 0;
    }
    else if ((local_24 == 3) || (local_24 == 6)) {
      local_11e1 = true;
    }
    sptk::StatisticsAccumulation::StatisticsAccumulation
              (&local_1200,local_14 + -1,(local_24 != 1) + 1,local_11e1,(bool)(local_42 & 1));
    sptk::StatisticsAccumulation::Buffer::Buffer
              ((Buffer *)CONCAT44(in_stack_ffffffffffffd834,in_stack_ffffffffffffd830));
    bVar3 = sptk::StatisticsAccumulation::IsValid(&local_1200);
    if (bVar3) {
      local_1428 = local_40;
      local_1430._M_current =
           (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                              ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                               in_stack_ffffffffffffd818);
      local_1438 = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end
                                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                       in_stack_ffffffffffffd818);
      goto LAB_00104e34;
    }
    std::__cxx11::ostringstream::ostringstream(local_13f8);
    std::operator<<((ostream *)local_13f8,"Failed to initialize StatisticsAccumulation");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1418,"vstat",&local_1419);
    sptk::PrintErrorMessage
              (in_stack_ffffffffffffda10,
               (ostringstream *)
               CONCAT17(in_stack_ffffffffffffda0f,
                        CONCAT16(in_stack_ffffffffffffda0e,
                                 CONCAT15(in_stack_ffffffffffffda0d,in_stack_ffffffffffffda08))));
    std::__cxx11::string::~string(local_1418);
    std::allocator<char>::~allocator((allocator<char> *)&local_1419);
    local_4 = 1;
    local_220 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_13f8);
    goto LAB_00105f56;
  }
  switch(local_48) {
  case 99:
    in_stack_ffffffffffffd9f8 = (StatisticsAccumulation *)local_5d1;
    in_stack_ffffffffffffd9f0 = ya_optarg;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_5d1 + 1),in_stack_ffffffffffffd9f0,
               (allocator *)in_stack_ffffffffffffd9f8);
    in_stack_ffffffffffffd9ef =
         sptk::ConvertStringToDouble(in_stack_ffffffffffffd828,(double *)in_stack_ffffffffffffd820);
    in_stack_ffffffffffffd9ed = true;
    if (((bool)in_stack_ffffffffffffd9ef) && (in_stack_ffffffffffffd9ed = true, 0.0 < local_20)) {
      in_stack_ffffffffffffd9ed = 100.0 <= local_20;
    }
    in_stack_ffffffffffffd9ee = in_stack_ffffffffffffd9ed;
    std::__cxx11::string::~string((string *)(local_5d1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_5d1);
    if ((in_stack_ffffffffffffd9ed & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_750);
      poVar7 = std::operator<<((ostream *)local_750,
                               "The argument for the -c option must be a number ");
      std::operator<<(poVar7,"in the open interval (0, 100)");
      paVar9 = &local_771;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_770,"vstat",paVar9);
      sptk::PrintErrorMessage
                (in_stack_ffffffffffffda10,
                 (ostringstream *)
                 CONCAT17(in_stack_ffffffffffffda0f,
                          CONCAT16(in_stack_ffffffffffffda0e,
                                   CONCAT15(in_stack_ffffffffffffda0d,in_stack_ffffffffffffda08))));
      std::__cxx11::string::~string(local_770);
      std::allocator<char>::~allocator((allocator<char> *)&local_771);
      local_4 = 1;
      local_220 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_750);
      goto LAB_00105fac;
    }
    goto LAB_00103850;
  case 100:
    local_41 = 1;
    goto LAB_00103850;
  case 0x65:
    local_42 = 1;
    goto LAB_00103850;
  default:
    anon_unknown.dwarf_25f2::PrintUsage
              ((ostream *)CONCAT17(in_stack_ffffffffffffd887,in_stack_ffffffffffffd880));
    local_4 = 1;
    local_220 = 1;
    goto LAB_00105fac;
  case 0x68:
    anon_unknown.dwarf_25f2::PrintUsage
              ((ostream *)CONCAT17(in_stack_ffffffffffffd887,in_stack_ffffffffffffd880));
    local_4 = 0;
    local_220 = 1;
    goto LAB_00105fac;
  case 0x6c:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,pcVar1,&local_79);
    bVar3 = sptk::ConvertStringToInteger(in_stack_ffffffffffffd828,(int *)in_stack_ffffffffffffd820)
    ;
    local_25aa = !bVar3 || local_14 < 1;
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    if (local_25aa) {
      std::__cxx11::ostringstream::ostringstream(local_1f8);
      std::operator<<((ostream *)local_1f8,
                      "The argument for the -l option must be a positive integer");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_218,"vstat",&local_219);
      sptk::PrintErrorMessage
                (in_stack_ffffffffffffda10,
                 (ostringstream *)
                 CONCAT17(in_stack_ffffffffffffda0f,
                          CONCAT16(in_stack_ffffffffffffda0e,
                                   CONCAT15(in_stack_ffffffffffffda0d,in_stack_ffffffffffffda08))));
      std::__cxx11::string::~string(local_218);
      std::allocator<char>::~allocator((allocator<char> *)&local_219);
      local_4 = 1;
      local_220 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1f8);
      goto LAB_00105fac;
    }
    goto LAB_00103850;
  case 0x6d:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_240,pcVar1,&local_241);
    bVar3 = sptk::ConvertStringToInteger(in_stack_ffffffffffffd828,(int *)in_stack_ffffffffffffd820)
    ;
    local_25ca = !bVar3 || local_14 < 0;
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    if (local_25ca) {
      std::__cxx11::ostringstream::ostringstream(local_3c0);
      poVar7 = std::operator<<((ostream *)local_3c0,"The argument for the -m option must be a ");
      std::operator<<(poVar7,"non-negative integer");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3e0,"vstat",&local_3e1);
      sptk::PrintErrorMessage
                (in_stack_ffffffffffffda10,
                 (ostringstream *)
                 CONCAT17(in_stack_ffffffffffffda0f,
                          CONCAT16(in_stack_ffffffffffffda0e,
                                   CONCAT15(in_stack_ffffffffffffda0d,in_stack_ffffffffffffda08))));
      std::__cxx11::string::~string(local_3e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
      local_4 = 1;
      local_220 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_3c0);
      goto LAB_00105fac;
    }
    local_14 = local_14 + 1;
    goto LAB_00103850;
  case 0x6f:
    local_778 = 0;
    local_77c = 7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_7a0,pcVar1,&local_7a1);
    bVar3 = sptk::ConvertStringToInteger(in_stack_ffffffffffffd828,(int *)in_stack_ffffffffffffd820)
    ;
    local_263a = 1;
    if (bVar3) {
      bVar3 = sptk::IsInRange(local_780,0,7);
      local_263a = bVar3 ^ 0xff;
    }
    std::__cxx11::string::~string(local_7a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
    if ((local_263a & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_920);
      poVar7 = std::operator<<((ostream *)local_920,
                               "The argument for the -o option must be an integer ");
      poVar7 = std::operator<<(poVar7,"in the range of ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0);
      poVar7 = std::operator<<(poVar7," to ");
      std::ostream::operator<<(poVar7,7);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_940,"vstat",&local_941);
      sptk::PrintErrorMessage
                (in_stack_ffffffffffffda10,
                 (ostringstream *)
                 CONCAT17(in_stack_ffffffffffffda0f,
                          CONCAT16(in_stack_ffffffffffffda0e,
                                   CONCAT15(in_stack_ffffffffffffda0d,in_stack_ffffffffffffda08))));
      std::__cxx11::string::~string(local_940);
      std::allocator<char>::~allocator((allocator<char> *)&local_941);
      local_4 = 1;
      local_220 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_920);
      goto LAB_00105fac;
    }
    local_24 = local_780;
    goto LAB_00103850;
  case 0x73:
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)
               CONCAT44(in_stack_ffffffffffffd834,in_stack_ffffffffffffd830),
               (value_type *)in_stack_ffffffffffffd828);
    goto LAB_00103850;
  case 0x74:
    goto switchD_001038e9_caseD_74;
  }
LAB_00104e34:
  bVar3 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                      *)in_stack_ffffffffffffd820,
                     (__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                      *)in_stack_ffffffffffffd818);
  if (!bVar3) goto LAB_00105880;
  ppcVar6 = __gnu_cxx::
            __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
            ::operator*(&local_1430);
  local_1440 = *ppcVar6;
  std::ifstream::ifstream(local_1648);
  pcVar1 = local_1440;
  std::operator|(_S_in,_S_bin);
  std::ifstream::open(local_1648,(_Ios_Openmode)pcVar1);
  bVar5 = std::ios::fail();
  if ((bVar5 & 1) == 0) {
    std::allocator<double>::allocator((allocator<double> *)0x10506b);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840),
               (size_type)in_stack_ffffffffffffd838,
               (allocator_type *)CONCAT44(in_stack_ffffffffffffd834,in_stack_ffffffffffffd830));
    std::allocator<double>::~allocator((allocator<double> *)0x105097);
    std::allocator<double>::allocator((allocator<double> *)0x1050bc);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840),
               (size_type)in_stack_ffffffffffffd838,
               (allocator_type *)CONCAT44(in_stack_ffffffffffffd834,in_stack_ffffffffffffd830));
    std::allocator<double>::~allocator((allocator<double> *)0x1050e8);
    sptk::SymmetricMatrix::SymmetricMatrix
              ((SymmetricMatrix *)
               CONCAT17(in_stack_ffffffffffffd867,
                        CONCAT16(in_stack_ffffffffffffd866,in_stack_ffffffffffffd860)),
               (int)((ulong)in_stack_ffffffffffffd858 >> 0x20));
    do {
      bVar3 = sptk::ReadStream<double>
                        ((double *)in_stack_ffffffffffffd828,(istream *)in_stack_ffffffffffffd820);
      if (!bVar3) {
        local_220 = 0;
        goto LAB_001057ee;
      }
      in_stack_ffffffffffffd818 = (option *)0x0;
      bVar3 = sptk::ReadStream<double>
                        (SUB81((ulong)in_stack_ffffffffffffd870 >> 0x30,0),
                         (int)in_stack_ffffffffffffd870,
                         (int)((ulong)in_stack_ffffffffffffd868 >> 0x20),
                         (int)in_stack_ffffffffffffd868,
                         (vector<double,_std::allocator<double>_> *)
                         CONCAT17(in_stack_ffffffffffffd867,
                                  CONCAT16(in_stack_ffffffffffffd866,in_stack_ffffffffffffd860)),
                         in_stack_ffffffffffffd858,
                         (int *)CONCAT17(in_stack_ffffffffffffd887,in_stack_ffffffffffffd880));
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream(local_19e8);
        poVar7 = std::operator<<((ostream *)local_19e8,"Failed to read statistics (first order) in "
                                );
        std::operator<<(poVar7,local_1440);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1a08,"vstat",&local_1a09);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffda10,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffda0f,
                            CONCAT16(in_stack_ffffffffffffda0e,
                                     CONCAT15(in_stack_ffffffffffffda0d,in_stack_ffffffffffffda08)))
                  );
        std::__cxx11::string::~string(local_1a08);
        std::allocator<char>::~allocator((allocator<char> *)&local_1a09);
        local_4 = 1;
        local_220 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_19e8);
        goto LAB_001057ee;
      }
      if ((local_11e1 & 1U) == 0) {
        bVar3 = sptk::ReadStream(in_stack_ffffffffffffd8b8,(istream *)in_stack_ffffffffffffd8b0);
        if (!bVar3) {
          std::__cxx11::ostringstream::ostringstream(local_1d28);
          poVar7 = std::operator<<((ostream *)local_1d28,
                                   "Failed to read statistics (second order) in ");
          poVar7 = std::operator<<(poVar7,local_1440);
          std::operator<<(poVar7," (expected full matrix)");
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1d48,"vstat",&local_1d49);
          sptk::PrintErrorMessage
                    (in_stack_ffffffffffffda10,
                     (ostringstream *)
                     CONCAT17(in_stack_ffffffffffffda0f,
                              CONCAT16(in_stack_ffffffffffffda0e,
                                       CONCAT15(in_stack_ffffffffffffda0d,in_stack_ffffffffffffda08)
                                      )));
          std::__cxx11::string::~string(local_1d48);
          std::allocator<char>::~allocator((allocator<char> *)&local_1d49);
          local_4 = 1;
          local_220 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_1d28);
          goto LAB_001057ee;
        }
      }
      else {
        in_stack_ffffffffffffd818 = (option *)0x0;
        bVar3 = sptk::ReadStream<double>
                          (SUB81((ulong)in_stack_ffffffffffffd870 >> 0x30,0),
                           (int)in_stack_ffffffffffffd870,
                           (int)((ulong)in_stack_ffffffffffffd868 >> 0x20),
                           (int)in_stack_ffffffffffffd868,
                           (vector<double,_std::allocator<double>_> *)
                           CONCAT17(in_stack_ffffffffffffd867,
                                    CONCAT16(in_stack_ffffffffffffd866,in_stack_ffffffffffffd860)),
                           in_stack_ffffffffffffd858,
                           (int *)CONCAT17(in_stack_ffffffffffffd887,in_stack_ffffffffffffd880));
        if ((!bVar3) ||
           (bVar3 = sptk::SymmetricMatrix::SetDiagonal
                              (in_stack_ffffffffffffd838,
                               (vector<double,_std::allocator<double>_> *)
                               CONCAT44(in_stack_ffffffffffffd834,in_stack_ffffffffffffd830)),
           !bVar3)) {
          std::__cxx11::ostringstream::ostringstream(local_1b88);
          in_stack_ffffffffffffd8b8 =
               (SymmetricMatrix *)
               std::operator<<((ostream *)local_1b88,"Failed to read statistics (second order) in ")
          ;
          in_stack_ffffffffffffd8b0 =
               std::operator<<((ostream *)in_stack_ffffffffffffd8b8,local_1440);
          std::operator<<(in_stack_ffffffffffffd8b0," (expected diagonal matrix)");
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1ba8,"vstat",&local_1ba9);
          sptk::PrintErrorMessage
                    (in_stack_ffffffffffffda10,
                     (ostringstream *)
                     CONCAT17(in_stack_ffffffffffffda0f,
                              CONCAT16(in_stack_ffffffffffffda0e,
                                       CONCAT15(in_stack_ffffffffffffda0d,in_stack_ffffffffffffda08)
                                      )));
          std::__cxx11::string::~string(local_1ba8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1ba9);
          local_4 = 1;
          local_220 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_1b88);
          goto LAB_001057ee;
        }
      }
      in_stack_ffffffffffffd887 =
           sptk::StatisticsAccumulation::Merge
                     (in_stack_ffffffffffffd9f8,(int)((ulong)in_stack_ffffffffffffd9f0 >> 0x20),
                      (vector<double,_std::allocator<double>_> *)
                      CONCAT17(in_stack_ffffffffffffd9ef,
                               CONCAT16(in_stack_ffffffffffffd9ee,
                                        CONCAT15(in_stack_ffffffffffffd9ed,in_stack_ffffffffffffd9e8
                                                ))),in_stack_ffffffffffffd9e0,
                      in_stack_ffffffffffffd9d8);
    } while ((bool)in_stack_ffffffffffffd887);
    std::__cxx11::ostringstream::ostringstream(local_1ec8);
    std::operator<<((ostream *)local_1ec8,"Failed to merge statistics");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1ee8,"vstat_merge",&local_1ee9);
    sptk::PrintErrorMessage
              (in_stack_ffffffffffffda10,
               (ostringstream *)
               CONCAT17(in_stack_ffffffffffffda0f,
                        CONCAT16(in_stack_ffffffffffffda0e,
                                 CONCAT15(in_stack_ffffffffffffda0d,in_stack_ffffffffffffda08))));
    std::__cxx11::string::~string(local_1ee8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1ee9);
    local_4 = 1;
    local_220 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1ec8);
LAB_001057ee:
    sptk::SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)in_stack_ffffffffffffd820);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffd834,in_stack_ffffffffffffd830));
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffd834,in_stack_ffffffffffffd830));
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_17c0);
    poVar7 = std::operator<<((ostream *)local_17c0,"Cannot open file ");
    std::operator<<(poVar7,local_1440);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_17e0,"vstat",&local_17e1);
    sptk::PrintErrorMessage
              (in_stack_ffffffffffffda10,
               (ostringstream *)
               CONCAT17(in_stack_ffffffffffffda0f,
                        CONCAT16(in_stack_ffffffffffffda0e,
                                 CONCAT15(in_stack_ffffffffffffda0d,in_stack_ffffffffffffda08))));
    std::__cxx11::string::~string(local_17e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_17e1);
    local_4 = 1;
    local_220 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_17c0);
  }
  std::ifstream::~ifstream(local_1648);
  if (local_220 != 0) goto LAB_00105f56;
  __gnu_cxx::
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
  operator++(&local_1430);
  goto LAB_00104e34;
switchD_001038e9_caseD_74:
  in_stack_ffffffffffffda10 = (string *)ya_optarg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_408,(char *)in_stack_ffffffffffffda10,&local_409);
  in_stack_ffffffffffffda0f =
       sptk::ConvertStringToInteger(in_stack_ffffffffffffd828,(int *)in_stack_ffffffffffffd820);
  in_stack_ffffffffffffda0d = !(bool)in_stack_ffffffffffffda0f || local_18 < 1;
  in_stack_ffffffffffffda0e = in_stack_ffffffffffffda0d;
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  if ((in_stack_ffffffffffffda0d & 1) != 0) goto LAB_00103e3f;
  goto LAB_00103850;
LAB_00103e3f:
  std::__cxx11::ostringstream::ostringstream(local_588);
  std::operator<<((ostream *)local_588,"The argument for the -t option must be a positive integer");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5a8,"vstat",&local_5a9);
  sptk::PrintErrorMessage
            (in_stack_ffffffffffffda10,
             (ostringstream *)
             CONCAT17(in_stack_ffffffffffffda0f,
                      CONCAT16(in_stack_ffffffffffffda0e,
                               CONCAT15(in_stack_ffffffffffffda0d,in_stack_ffffffffffffda08))));
  std::__cxx11::string::~string(local_5a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
  local_4 = 1;
  local_220 = 1;
  std::__cxx11::ostringstream::~ostringstream(local_588);
  goto LAB_00105fac;
LAB_00105880:
  lVar8 = (long)local_14;
  puVar10 = local_1f09;
  std::allocator<double>::allocator((allocator<double> *)0x10589f);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_ffffffffffffd847,in_stack_ffffffffffffd840),
             (size_type)in_stack_ffffffffffffd838,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffd834,in_stack_ffffffffffffd830));
  std::allocator<double>::~allocator((allocator<double> *)0x1058c5);
  local_1f10 = 1;
  while( true ) {
    buffer_00 = (Buffer *)0x0;
    in_stack_ffffffffffffd867 =
         sptk::ReadStream<double>
                   (SUB81((ulong)puVar10 >> 0x30,0),(int)puVar10,(int)((ulong)lVar8 >> 0x20),
                    (int)lVar8,
                    (vector<double,_std::allocator<double>_> *)
                    CONCAT17(in_stack_ffffffffffffd867,
                             CONCAT16(in_stack_ffffffffffffd866,in_stack_ffffffffffffd860)),
                    in_stack_ffffffffffffd858,
                    (int *)CONCAT17(in_stack_ffffffffffffd887,in_stack_ffffffffffffd880));
    if (!(bool)in_stack_ffffffffffffd867) break;
    in_stack_ffffffffffffd866 =
         sptk::StatisticsAccumulation::Run
                   (in_stack_ffffffffffffd988,data_00,
                    (Buffer *)CONCAT17(uVar4,in_stack_ffffffffffffd978));
    if (!(bool)in_stack_ffffffffffffd866) {
      std::__cxx11::ostringstream::ostringstream(local_2088);
      std::operator<<((ostream *)local_2088,"Failed to accumulate statistics");
      paVar9 = &local_20a9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_20a8,"vstat",paVar9);
      sptk::PrintErrorMessage
                (in_stack_ffffffffffffda10,
                 (ostringstream *)
                 CONCAT17(in_stack_ffffffffffffda0f,
                          CONCAT16(in_stack_ffffffffffffda0e,
                                   CONCAT15(in_stack_ffffffffffffda0d,in_stack_ffffffffffffda08))));
      std::__cxx11::string::~string(local_20a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_20a9);
      local_4 = 1;
      local_220 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_2088);
      goto LAB_00105f38;
    }
    if ((local_18 != -1) && (local_1f10 % local_18 == 0)) {
      bVar3 = anon_unknown.dwarf_25f2::OutputStatistics
                        (in_stack_ffffffffffffdb98,in_stack_ffffffffffffdb90,
                         in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88,
                         in_stack_ffffffffffffdb80,(bool)in_stack_ffffffffffffdb7f);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream(local_2228);
        std::operator<<((ostream *)local_2228,"Failed to write statistics");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2248,"vstat",&local_2249);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffda10,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffda0f,
                            CONCAT16(in_stack_ffffffffffffda0e,
                                     CONCAT15(in_stack_ffffffffffffda0d,in_stack_ffffffffffffda08)))
                  );
        std::__cxx11::string::~string(local_2248);
        std::allocator<char>::~allocator((allocator<char> *)&local_2249);
        local_4 = 1;
        local_220 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_2228);
        goto LAB_00105f38;
      }
      sptk::StatisticsAccumulation::Clear
                ((StatisticsAccumulation *)in_stack_ffffffffffffd820,buffer_00);
    }
    local_1f10 = local_1f10 + 1;
  }
  bVar3 = sptk::StatisticsAccumulation::GetNumData(&local_1200,&local_1280,&local_2250);
  if (bVar3) {
    if ((local_18 == -1) && (0 < local_2250)) {
      bVar3 = anon_unknown.dwarf_25f2::OutputStatistics
                        (in_stack_ffffffffffffdb98,in_stack_ffffffffffffdb90,
                         in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88,
                         in_stack_ffffffffffffdb80,(bool)in_stack_ffffffffffffdb7f);
      in_stack_ffffffffffffd834 = CONCAT13(bVar3,(int3)in_stack_ffffffffffffd834);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream(local_2568);
        std::operator<<((ostream *)local_2568,"Failed to write statistics");
        paVar9 = &local_2589;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2588,"vstat",paVar9);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffda10,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffda0f,
                            CONCAT16(in_stack_ffffffffffffda0e,
                                     CONCAT15(in_stack_ffffffffffffda0d,in_stack_ffffffffffffda08)))
                  );
        std::__cxx11::string::~string(local_2588);
        std::allocator<char>::~allocator((allocator<char> *)&local_2589);
        local_4 = 1;
        local_220 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_2568);
        goto LAB_00105f38;
      }
    }
    local_4 = 0;
    local_220 = 1;
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_23c8);
    std::operator<<((ostream *)local_23c8,"Failed to accumulate statistics");
    paVar9 = &local_23e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_23e8,"vstat",paVar9);
    sptk::PrintErrorMessage
              (in_stack_ffffffffffffda10,
               (ostringstream *)
               CONCAT17(in_stack_ffffffffffffda0f,
                        CONCAT16(in_stack_ffffffffffffda0e,
                                 CONCAT15(in_stack_ffffffffffffda0d,in_stack_ffffffffffffda08))));
    std::__cxx11::string::~string(local_23e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_23e9);
    local_4 = 1;
    local_220 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_23c8);
  }
LAB_00105f38:
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffd834,in_stack_ffffffffffffd830));
LAB_00105f56:
  sptk::StatisticsAccumulation::Buffer::~Buffer(in_stack_ffffffffffffd820);
  sptk::StatisticsAccumulation::~StatisticsAccumulation(&local_1200);
LAB_00105f8e:
  std::ifstream::~ifstream(local_1038);
LAB_00105fac:
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)
             CONCAT44(in_stack_ffffffffffffd834,in_stack_ffffffffffffd830));
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int vector_length(kDefaultVectorLength);
  int output_interval(kMagicNumberForEndOfFile);
  double confidence_level(kDefaultConfidenceLevel);
  OutputFormats output_format(kDefaultOutputFormat);
  std::vector<const char*> statistics_file;
  bool outputs_only_diagonal_elements(kDefaultOutputOnlyDiagonalElementsFlag);
  bool numerically_stable(kDefaultNumericallyStableFlag);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "l:m:t:c:o:s:deh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("vstat", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("vstat", error_message);
          return 1;
        }
        ++vector_length;
        break;
      }
      case 't': {
        if (!sptk::ConvertStringToInteger(optarg, &output_interval) ||
            output_interval <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -t option must be a positive integer";
          sptk::PrintErrorMessage("vstat", error_message);
          return 1;
        }
        break;
      }
      case 'c': {
        if (!sptk::ConvertStringToDouble(optarg, &confidence_level) ||
            confidence_level <= 0.0 || 100.0 <= confidence_level) {
          std::ostringstream error_message;
          error_message << "The argument for the -c option must be a number "
                        << "in the open interval (0, 100)";
          sptk::PrintErrorMessage("vstat", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("vstat", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 's': {
        statistics_file.push_back(optarg);
        break;
      }
      case 'd': {
        outputs_only_diagonal_elements = true;
        break;
      }
      case 'e': {
        numerically_stable = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (kMagicNumberForEndOfFile != output_interval && !statistics_file.empty()) {
    std::ostringstream error_message;
    error_message << "Cannot specify -t option and -s option at the same time";
    sptk::PrintErrorMessage("vstat", error_message);
    return 1;
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("vstat", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("vstat", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("vstat", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  bool diagonal(false);
  if (kMeanAndCovariance == output_format || kCovariance == output_format ||
      kSufficientStatistics == output_format) {
    if (outputs_only_diagonal_elements) {
      diagonal = true;
    }
  } else if (kStandardDeviation == output_format ||
             kMeanAndLowerAndUpperBounds == output_format) {
    diagonal = true;
  }

  sptk::StatisticsAccumulation accumulation(vector_length - 1,
                                            kMean == output_format ? 1 : 2,
                                            diagonal, numerically_stable);
  sptk::StatisticsAccumulation::Buffer buffer;
  if (!accumulation.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize StatisticsAccumulation";
    sptk::PrintErrorMessage("vstat", error_message);
    return 1;
  }

  for (const char* file : statistics_file) {
    std::ifstream ifs2;
    ifs2.open(file, std::ios::in | std::ios::binary);
    if (ifs2.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << file;
      sptk::PrintErrorMessage("vstat", error_message);
      return 1;
    }

    double num_data;
    std::vector<double> first(vector_length);
    std::vector<double> tmp(vector_length);
    sptk::SymmetricMatrix second(vector_length);
    while (sptk::ReadStream(&num_data, &ifs2)) {
      if (!sptk::ReadStream(false, 0, 0, vector_length, &first, &ifs2, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to read statistics (first order) in " << file;
        sptk::PrintErrorMessage("vstat", error_message);
        return 1;
      }

      if (diagonal) {
        if (!sptk::ReadStream(false, 0, 0, vector_length, &tmp, &ifs2, NULL) ||
            !second.SetDiagonal(tmp)) {
          std::ostringstream error_message;
          error_message << "Failed to read statistics (second order) in "
                        << file << " (expected diagonal matrix)";
          sptk::PrintErrorMessage("vstat", error_message);
          return 1;
        }
      } else {
        if (!sptk::ReadStream(&second, &ifs2)) {
          std::ostringstream error_message;
          error_message << "Failed to read statistics (second order) in "
                        << file << " (expected full matrix)";
          sptk::PrintErrorMessage("vstat", error_message);
          return 1;
        }
      }

      if (!accumulation.Merge(static_cast<int>(num_data), first, second,
                              &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to merge statistics";
        sptk::PrintErrorMessage("vstat_merge", error_message);
        return 1;
      }
    }
  }

  std::vector<double> data(vector_length);
  for (int vector_index(1);
       sptk::ReadStream(false, 0, 0, vector_length, &data, &input_stream, NULL);
       ++vector_index) {
    if (!accumulation.Run(data, &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to accumulate statistics";
      sptk::PrintErrorMessage("vstat", error_message);
      return 1;
    }

    if (kMagicNumberForEndOfFile != output_interval &&
        0 == vector_index % output_interval) {
      if (!OutputStatistics(accumulation, buffer, vector_length, output_format,
                            confidence_level, outputs_only_diagonal_elements)) {
        std::ostringstream error_message;
        error_message << "Failed to write statistics";
        sptk::PrintErrorMessage("vstat", error_message);
        return 1;
      }
      accumulation.Clear(&buffer);
    }
  }

  int num_data;
  if (!accumulation.GetNumData(buffer, &num_data)) {
    std::ostringstream error_message;
    error_message << "Failed to accumulate statistics";
    sptk::PrintErrorMessage("vstat", error_message);
    return 1;
  }

  if (kMagicNumberForEndOfFile == output_interval && 0 < num_data) {
    if (!OutputStatistics(accumulation, buffer, vector_length, output_format,
                          confidence_level, outputs_only_diagonal_elements)) {
      std::ostringstream error_message;
      error_message << "Failed to write statistics";
      sptk::PrintErrorMessage("vstat", error_message);
      return 1;
    }
  }

  return 0;
}